

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferBlock::_Write(BufferBlock *this,char *data,uint32_t len)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  size_t left;
  size_t size_1;
  size_t size_end;
  size_t size_start;
  size_t size;
  uint32_t len_local;
  char *data_local;
  BufferBlock *this_local;
  
  this_local._4_4_ = len;
  if (this->_write < this->_read) {
    uVar1 = (long)this->_read - (long)this->_write;
    if (uVar1 < len) {
      memcpy(this->_write,data,uVar1);
      this->_write = this->_write + uVar1;
      this->_can_read = true;
      this_local._4_4_ = (uint32_t)uVar1;
    }
    else {
      memcpy(this->_write,data,(ulong)len);
      this->_write = this->_write + len;
      if (this->_write == this->_read) {
        this->_can_read = true;
      }
    }
  }
  else if (((this->_can_read & 1U) == 0) || (this->_read != this->_write)) {
    __n = (long)this->_read - (long)this->_buffer_start;
    uVar1 = (long)this->_buffer_end - (long)this->_write;
    uVar2 = __n + uVar1;
    if (len < uVar2) {
      if (uVar1 < len) {
        memcpy(this->_write,data,uVar1);
        memcpy(this->_buffer_start,data + uVar1,len - uVar1);
        this->_write = this->_buffer_start + (len - uVar1);
      }
      else {
        memcpy(this->_write,data,(ulong)len);
        this->_write = this->_write + len;
      }
    }
    else {
      memcpy(this->_write,data,uVar1);
      memcpy(this->_buffer_start,data + uVar1,__n);
      this->_write = this->_read;
      this->_can_read = true;
      this_local._4_4_ = (uint32_t)uVar2;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::_Write(const char* data, uint32_t len) {
    /*s-----------w-----r-------------e*/
    if (_write < _read) {
        size_t size = _read - _write;
        // can save all data
        if (len <= size) {
            memcpy(_write, data, len);
            _write += len;
            if (_write == _read) {
                _can_read = true;
            }
            return len;

        // can save a part of data
        } else {
            memcpy(_write, data, size);
            _write += size;
            _can_read = true;

            return (uint32_t)size;
        }
    
    /*s-----------r-----w-------------e*/
    /*s-----------rw------------------e*/
    } else {
        if(_can_read && _read == _write) {
            return 0;
        }

        size_t size_start = _read - _buffer_start;
        size_t size_end = _buffer_end - _write;
        size_t size =  size_start + size_end;

        // all buffer will be used
        if (size <= len) {
            memcpy(_write, data, size_end);
            memcpy(_buffer_start, data + size_end, size_start);

            _write = _read;
            _can_read = true;
            return (int32_t)size;

        // part of buffer will be used
        } else {
            if (len <= size_end) {
                memcpy(_write, data, len);
                _write += len;
                return len;

            } else {
                size_t left = len - size_end;

                memcpy(_write, data, size_end);
                memcpy(_buffer_start, data + size_end, left);
               
                _write = _buffer_start + left;
                return len;
            }
        }
    }
}